

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

string * __thiscall
cppcms::application::translate_abi_cxx11_
          (string *__return_storage_ptr__,application *this,char *single,char *plural,int n)

{
  undefined1 auStack_a8 [16];
  hold_ptr<cppcms::http::context::_data> local_98;
  element_type *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  undefined8 local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  undefined8 local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  undefined8 local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  local_90 = (element_type *)0x0;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  local_38 = 0;
  local_30._M_local_buf[0] = '\0';
  auStack_a8._8_4_ = n;
  local_98.ptr_ = (_data *)single;
  local_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plural;
  local_80 = &local_70;
  local_60 = &local_50;
  local_40 = &local_30;
  context(this);
  http::context::locale((context *)auStack_a8);
  booster::locale::basic_message<char>::str_abi_cxx11_
            (__return_storage_ptr__,(basic_message<char> *)(auStack_a8 + 8),(locale *)auStack_a8,0);
  std::locale::~locale((locale *)auStack_a8);
  if (local_40 != &local_30) {
    operator_delete(local_40);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string application::translate(char const *single,char const *plural,int n)
{
	return booster::locale::translate(single,plural,n).str(context().locale());
}